

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDarRetimeStep(Abc_Ntk_t *pNtk,int fVerbose)

{
  Vec_Int_t *__ptr;
  Aig_Man_t *p;
  Abc_Ntk_t *pAVar1;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    p = Abc_NtkToDar(pNtk,0,1);
    if (p == (Aig_Man_t *)0x0) {
      pAVar1 = (Abc_Ntk_t *)0x0;
    }
    else {
      __ptr = p->vFlopNums;
      if (__ptr != (Vec_Int_t *)0x0) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (int *)0x0;
        }
        free(__ptr);
      }
      p->vFlopNums = (Vec_Int_t *)0x0;
      Aig_ManPrintStats(p);
      Saig_ManRetimeSteps(p,1000,1,0);
      Aig_ManPrintStats(p);
      pAVar1 = Abc_NtkFromDarSeqSweep(pNtk,p);
      Aig_ManStop(p);
    }
    return pAVar1;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDar.c"
                ,0xd41,"Abc_Ntk_t *Abc_NtkDarRetimeStep(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDarRetimeStep( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( pMan->vFlopNums )
        Vec_IntFree( pMan->vFlopNums ); 
    pMan->vFlopNums = NULL;

    Aig_ManPrintStats(pMan);
    Saig_ManRetimeSteps( pMan, 1000, 1, 0 );
    Aig_ManPrintStats(pMan);

    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}